

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgettextcontrol_p.cpp
# Opt level: O3

void QUnicodeControlCharacterMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QTextEdit *this;
  QLineEdit *this_00;
  long lVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QList<QAction_*> QStack_38;
  long lStack_20;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  lStack_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::sender();
  lVar3 = QMetaObject::cast((QObject *)&QAction::staticMetaObject);
  QWidget::actions(&QStack_38,(QWidget *)_o);
  uVar5 = 0xffffffff;
  if ((undefined1 *)QStack_38.d.size != (undefined1 *)0x0) {
    lVar4 = -8;
    do {
      if (QStack_38.d.size * -8 + lVar4 == -8) goto LAB_004c9715;
      lVar1 = lVar4 + 8;
      lVar2 = lVar4 + 8;
      lVar4 = lVar1;
    } while (*(long *)((long)QStack_38.d.ptr + lVar2) != lVar3);
    uVar5 = (uint)(lVar1 >> 3);
  }
LAB_004c9715:
  if (&(QStack_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(QStack_38.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (uVar5 < 0xe) {
    QStack_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStack_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_38.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)&QStack_38,
                     (QChar)(char16_t)
                            *(undefined4 *)
                             ((long)&qt_controlCharacters[0].character + (ulong)((uVar5 & 0xf) << 4)
                             ));
    this = (QTextEdit *)QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
    if (this == (QTextEdit *)0x0) {
      lVar3 = QMetaObject::cast((QObject *)&QWidgetTextControl::staticMetaObject);
      if (lVar3 != 0) {
        QTextCursor::insertText((QString *)(*(long *)(lVar3 + 8) + 0x88));
      }
      this_00 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
      if (this_00 != (QLineEdit *)0x0) {
        QLineEdit::insert(this_00,(QString *)&QStack_38);
      }
    }
    else {
      QTextEdit::insertPlainText(this,(QString *)&QStack_38);
    }
    if (&(QStack_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnicodeControlCharacterMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUnicodeControlCharacterMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->menuActionTriggered(); break;
        default: ;
        }
    }
    (void)_a;
}